

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

UDataMemory * udata_cacheDataItem(char *path,UDataMemory *item,UErrorCode *pErr)

{
  UHashtable *hash;
  undefined8 *value;
  UDataMemory *dest;
  char *__s;
  size_t sVar1;
  char *__dest;
  void *pvVar2;
  UErrorCode subErr;
  
  subErr = U_ZERO_ERROR;
  hash = udata_getHashTable(pErr);
  if (*pErr < U_ILLEGAL_ARGUMENT_ERROR) {
    value = (undefined8 *)uprv_malloc_63(0x10);
    if (value == (undefined8 *)0x0) {
      *pErr = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      dest = UDataMemory_createNewInstance_63(pErr);
      value[1] = dest;
      if (*pErr < U_ILLEGAL_ARGUMENT_ERROR) {
        UDatamemory_assign_63(dest,item);
        __s = findBasename(path);
        sVar1 = strlen(__s);
        __dest = (char *)uprv_malloc_63((long)((int)sVar1 + 1));
        *value = __dest;
        if (__dest != (char *)0x0) {
          strcpy(__dest,__s);
          umtx_lock_63((UMutex *)0x0);
          pvVar2 = uhash_get_63(hash,path);
          if (pvVar2 == (void *)0x0) {
            uhash_put_63(hash,(void *)*value,value,&subErr);
          }
          else {
            subErr = U_USING_DEFAULT_WARNING;
          }
          umtx_unlock_63((UMutex *)0x0);
          if (subErr == U_USING_DEFAULT_WARNING || U_ZERO_ERROR < subErr) {
            *pErr = subErr;
            uprv_free_63((void *)*value);
            uprv_free_63((void *)value[1]);
            uprv_free_63(value);
            if (pvVar2 == (void *)0x0) {
              return (UDataMemory *)0x0;
            }
            return *(UDataMemory **)((long)pvVar2 + 8);
          }
          return (UDataMemory *)value[1];
        }
        *pErr = U_MEMORY_ALLOCATION_ERROR;
        uprv_free_63((void *)value[1]);
      }
      uprv_free_63(value);
    }
  }
  return (UDataMemory *)0x0;
}

Assistant:

static UDataMemory *udata_cacheDataItem(const char *path, UDataMemory *item, UErrorCode *pErr) {
    DataCacheElement *newElement;
    const char       *baseName;
    int32_t           nameLen;
    UHashtable       *htable;
    DataCacheElement *oldValue = NULL;
    UErrorCode        subErr = U_ZERO_ERROR;

    htable = udata_getHashTable(*pErr);
    if (U_FAILURE(*pErr)) {
        return NULL;
    }

    /* Create a new DataCacheElement - the thingy we store in the hash table -
     * and copy the supplied path and UDataMemoryItems into it.
     */
    newElement = (DataCacheElement *)uprv_malloc(sizeof(DataCacheElement));
    if (newElement == NULL) {
        *pErr = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    newElement->item = UDataMemory_createNewInstance(pErr);
    if (U_FAILURE(*pErr)) {
        uprv_free(newElement);
        return NULL;
    }
    UDatamemory_assign(newElement->item, item);

    baseName = findBasename(path);
    nameLen = (int32_t)uprv_strlen(baseName);
    newElement->name = (char *)uprv_malloc(nameLen+1);
    if (newElement->name == NULL) {
        *pErr = U_MEMORY_ALLOCATION_ERROR;
        uprv_free(newElement->item);
        uprv_free(newElement);
        return NULL;
    }
    uprv_strcpy(newElement->name, baseName);

    /* Stick the new DataCacheElement into the hash table.
    */
    umtx_lock(NULL);
    oldValue = (DataCacheElement *)uhash_get(htable, path);
    if (oldValue != NULL) {
        subErr = U_USING_DEFAULT_WARNING;
    }
    else {
        uhash_put(
            htable,
            newElement->name,               /* Key   */
            newElement,                     /* Value */
            &subErr);
    }
    umtx_unlock(NULL);

#ifdef UDATA_DEBUG
    fprintf(stderr, "Cache: [%s] <<< %p : %s. vFunc=%p\n", newElement->name, 
    newElement->item, u_errorName(subErr), newElement->item->vFuncs);
#endif

    if (subErr == U_USING_DEFAULT_WARNING || U_FAILURE(subErr)) {
        *pErr = subErr; /* copy sub err unto fillin ONLY if something happens. */
        uprv_free(newElement->name);
        uprv_free(newElement->item);
        uprv_free(newElement);
        return oldValue ? oldValue->item : NULL;
    }

    return newElement->item;
}